

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_client::execute_resolver
          (asio_rpc_client *this,ptr<asio_rpc_client> *self,ptr<req_msg> *req,string *host,
          string *port,rpc_handler *when_done,uint64_t send_timeout_ms)

{
  query *q_00;
  string *in_RCX;
  anon_class_144_7_15cfdda5 *in_RSI;
  long in_RDI;
  string *in_R8;
  undefined8 in_stack_00000008;
  query q;
  shared_ptr<nuraft::asio_rpc_client> *in_stack_fffffffffffffe78;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *this_00;
  undefined8 in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  string local_e8 [32];
  string local_c8 [32];
  undefined8 local_a8;
  string *local_28;
  string *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             (flags)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  q_00 = (query *)(in_RDI + 0x20);
  this_00 = (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
             *)&stack0xfffffffffffffed0;
  std::shared_ptr<nuraft::asio_rpc_client>::shared_ptr(&in_RSI->self,in_stack_fffffffffffffe78);
  std::shared_ptr<nuraft::req_msg>::shared_ptr
            ((shared_ptr<nuraft::req_msg> *)in_RSI,
             (shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffe78);
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function(this_00,(function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                    *)q_00);
  std::__cxx11::string::string(local_e8,local_20);
  std::__cxx11::string::string(local_c8,local_28);
  local_a8 = in_stack_00000008;
  asio::ip::basic_resolver<asio::ip::tcp,asio::any_io_executor>::
  async_resolve<nuraft::asio_rpc_client::execute_resolver(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long)::_lambda(std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)_1_>
            ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)this_00,q_00,in_RSI);
  execute_resolver(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long)
  ::{lambda(std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::
  ~basic_resolver_iterator(in_RSI);
  asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)in_RSI);
  return;
}

Assistant:

void execute_resolver(ptr<asio_rpc_client> self,
                          ptr<req_msg> req,
                          const std::string& host,
                          const std::string& port,
                          rpc_handler when_done,
                          uint64_t send_timeout_ms) {
        asio::ip::tcp::resolver::query q
            ( host, port, asio::ip::tcp::resolver::query::all_matching );

        resolver_.async_resolve
        ( q,
          [self, this, req, when_done, host, port, send_timeout_ms]
          ( std::error_code err,
            asio::ip::tcp::resolver::iterator itor ) -> void
        {
            if (!err) {
                asio::async_connect
                    ( socket(),
                      itor,
                      std::bind( &asio_rpc_client::connected,
                                 self,
                                 req,
                                 when_done,
                                 send_timeout_ms,
                                 std::placeholders::_1,
                                 std::placeholders::_2 ) );
            } else {
                ptr<resp_msg> rsp;
                ptr<rpc_exception> except
                   ( cs_new<rpc_exception>
                           ( lstrfmt("failed to resolve host %s "
                                     "due to error %d, %s")
                                    .fmt( host.c_str(),
                                          err.value(),
                                          err.message().c_str() ),
                             req ) );
                when_done(rsp, except);
            }
        } );
    }